

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# super.c
# Opt level: O2

int Super_CommandSupergates(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint fVerbose;
  uint uVar4;
  FILE *__stream;
  undefined4 extraout_var;
  FILE *__stream_00;
  Mio_Library_t *pLib;
  char *pcVar5;
  char *pcVar6;
  float fVar7;
  double dVar8;
  size_t __size;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  float local_60;
  float local_5c;
  ulong local_40;
  char *local_38;
  
  Abc_FrameReadOut(pAbc);
  __stream = (FILE *)Abc_FrameReadErr(pAbc);
  local_38 = (char *)0x0;
  Extra_UtilGetoptReset();
  local_64 = 2;
  local_40 = 5;
  local_6c = 1;
  local_60 = 0.0;
  local_5c = 0.0;
  bVar1 = false;
  local_68 = 0;
  local_70 = 0;
  fVerbose = 0;
LAB_00350e9e:
  do {
    iVar3 = Extra_UtilGetopt(argc,argv,"ILNTDAEsovh");
    iVar2 = globalUtilOptind;
    switch(iVar3) {
    case 0x41:
      dVar8 = atof(argv[globalUtilOptind]);
      fVar7 = (float)dVar8;
      local_5c = fVar7;
      goto LAB_00350fa1;
    case 0x42:
    case 0x43:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4d:
      goto switchD_00350ebc_caseD_42;
    case 0x44:
      dVar8 = atof(argv[globalUtilOptind]);
      fVar7 = (float)dVar8;
      local_60 = fVar7;
LAB_00350fa1:
      globalUtilOptind = iVar2 + 1;
      if (fVar7 <= 0.0) goto switchD_00350ebc_caseD_42;
      goto LAB_00350e9e;
    case 0x45:
      local_38 = argv[globalUtilOptind];
      if (local_38 == (char *)0x0) goto switchD_00350ebc_caseD_42;
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_00350e9e;
    case 0x49:
      uVar4 = atoi(argv[globalUtilOptind]);
      local_40 = CONCAT44(extraout_var,uVar4);
      break;
    case 0x4c:
      local_64 = atoi(argv[globalUtilOptind]);
      uVar4 = local_64;
      break;
    case 0x4e:
      local_68 = atoi(argv[globalUtilOptind]);
      uVar4 = local_68;
      break;
    default:
      if (iVar3 != 0x54) {
        if (iVar3 == 0x6f) {
          bVar1 = (bool)(bVar1 ^ 1);
        }
        else if (iVar3 == 0x73) {
          local_6c = local_6c ^ 1;
        }
        else {
          if (iVar3 != 0x76) {
            if (iVar3 != -1) goto switchD_00350ebc_caseD_42;
            if (globalUtilOptind + 1 == argc) {
              if ((int)local_40 - 7U < 0xfffffffb) {
                fprintf(__stream,
                        "The max number of variables (%d) should be more than 1 and less than 7.\n",
                        local_40 & 0xffffffff);
                goto switchD_00350ebc_caseD_42;
              }
              pcVar5 = argv[globalUtilOptind];
              __stream_00 = (FILE *)Io_FileOpen(pcVar5,"open_path","r",0);
              if (__stream_00 == (FILE *)0x0) {
                fprintf(__stream,"Cannot open input file \"%s\". ",pcVar5);
                pcVar5 = Extra_FileGetSimilarName(pcVar5,".genlib",".lib",".gen",".g",(char *)0x0);
                if (pcVar5 != (char *)0x0) {
                  fprintf(__stream,"Did you mean \"%s\"?",pcVar5);
                }
                fputc(10,__stream);
                return 1;
              }
              fclose(__stream_00);
              pLib = Mio_LibraryRead(pcVar5,(char *)0x0,local_38,fVerbose);
              if (pLib != (Mio_Library_t *)0x0) {
                pcVar5 = Mio_LibraryReadName(pLib);
                pcVar5 = Extra_FileNameGenericAppend(pcVar5,".super");
                Super_Precompute(pLib,(int)local_40,local_64,local_68,local_60,local_5c,local_70,
                                 local_6c,fVerbose,pcVar5);
                Mio_LibraryDelete(pLib);
                return 0;
              }
              pcVar5 = "Reading library has failed.\n";
              __size = 0x1c;
            }
            else {
              pcVar5 = "The genlib library file should be given on the command line.\n";
              __size = 0x3d;
            }
            fwrite(pcVar5,__size,1,__stream);
            goto switchD_00350ebc_caseD_42;
          }
          fVerbose = fVerbose ^ 1;
        }
        goto LAB_00350e9e;
      }
      local_70 = atoi(argv[globalUtilOptind]);
      uVar4 = local_70;
    }
    globalUtilOptind = iVar2 + 1;
    if ((int)uVar4 < 0) {
switchD_00350ebc_caseD_42:
      fwrite("usage: super [-ILNT num] [-DA float] [-E file] [-sovh] <genlib_file>\n",0x45,1,
             __stream);
      fwrite("\t         precomputes the supergates for the given genlib library\n",0x42,1,__stream)
      ;
      fprintf(__stream,"\t-I num   : the max number of supergate inputs [default = %d]\n",local_40);
      fprintf(__stream,"\t-L num   : the max number of levels of gates [default = %d]\n",
              (ulong)local_64);
      fprintf(__stream,
              "\t-N num   : the limit on the number of considered supergates [default = %d]\n",
              (ulong)local_68);
      fprintf(__stream,"\t-T num   : the approximate runtime limit in seconds [default = %d]\n",
              (ulong)local_70);
      fprintf(__stream,"\t-D float : the max delay of the supergates [default = %.2f]\n",
              (double)local_60);
      fprintf(__stream,"\t-A float : the max area of the supergates [default = %.2f]\n",
              (double)local_5c);
      fwrite("\t-E file  : file contains list of genlib gates to exclude\n",0x3a,1,__stream);
      pcVar6 = "yes";
      pcVar5 = "no";
      if (local_6c == 0) {
        pcVar5 = "yes";
      }
      fprintf(__stream,"\t-s       : toggle the use of inverters at the inputs [default = %s]\n",
              pcVar5);
      pcVar5 = "yes";
      if (!bVar1) {
        pcVar5 = "no";
      }
      fprintf(__stream,
              "\t-o       : toggle dumping the supergate library in old format [default = %s]\n",
              pcVar5);
      if (fVerbose == 0) {
        pcVar6 = "no";
      }
      fprintf(__stream,"\t-v       : enable verbose output [default = %s]\n",pcVar6);
      fwrite("\t-h       : print the help message\n",0x23,1,__stream);
      fputc(10,__stream);
      fwrite("\tHere is a piece of advice on precomputing supergate libraries:\n",0x40,1,__stream);
      fwrite("\t\n",2,1,__stream);
      fwrite("\tStart with the number of inputs equal to 5 (-I 5), the number of \n",0x43,1,__stream
            );
      fwrite("\tlevels equal to 2 (-L 2), the delay equal to 2-3 delays of inverter, \n",0x47,1,
             __stream);
      fwrite("\tthe area equal to 2-3 areas of two input NAND, and runtime limit equal \n",0x49,1,
             __stream);
      fwrite("\tto 10 seconds (-T 10). Run precomputation and learn from the result.\n",0x46,1,
             __stream);
      fwrite("\tDetermine what parameter is most constraining and try to increase \n",0x44,1,
             __stream);
      fwrite("\tthe value of that parameter. The goal is to have a well-balanced\n",0x42,1,__stream)
      ;
      fwrite("\tset of constraints and the resulting supergate library containing\n",0x43,1,__stream
            );
      fwrite("\tapproximately 5K-20K supergates. Typically, it is better to increase\n",0x46,1,
             __stream);
      fwrite("\tdelay limit rather than area limit, because having large-area supergates\n",0x4a,1,
             __stream);
      fwrite("\tmay result in a considerable increase in area.\n",0x30,1,__stream);
      fwrite("\t\n",2,1,__stream);
      fwrite("\tNote that a good supergate library for experiments typically can be \n",0x46,1,
             __stream);
      fwrite("\tprecomputed in 30 sec or less. Increasing runtime limit makes sense when\n",0x4a,1,
             __stream);
      fwrite("\tother parameters are well-balanced and it is needed to enumerate more\n",0x47,1,
             __stream);
      fwrite("\tchoices to have a good result. In the end, to compute the final library\n",0x49,1,
             __stream);
      fwrite("\tthe runtime can be set to 300 sec to ensure the ultimate quality.\n",0x43,1,__stream
            );
      fwrite("\tIn some cases, the runtime has to be reduced if the supergate library\n",0x47,1,
             __stream);
      fwrite("\tcontains too many supergates (> 500K).\n",0x28,1,__stream);
      fwrite("\t\n",2,1,__stream);
      fwrite("\tWhen precomputing libraries of 6 inputs (-i 6), start with even more \n",0x47,1,
             __stream);
      fwrite("\trestricted parameters and gradually increase them until the goal is met.\n",0x4a,1,
             __stream);
      fwrite("\t\n",2,1,__stream);
      return 1;
    }
  } while( true );
}

Assistant:

int Super_CommandSupergates( Abc_Frame_t * pAbc, int argc, char **argv )
{
    FILE * pFile;
    FILE * pOut, * pErr;
    Mio_Library_t * pLib;
    char * FileName, * ExcludeFile;
    float DelayLimit;
    float AreaLimit;
    int fSkipInvs;
    int fWriteOldFormat; 
    int nVarsMax, nLevels, nGatesMax, TimeLimit;
    int fVerbose;
    int c;

    pOut = Abc_FrameReadOut(pAbc);
    pErr = Abc_FrameReadErr(pAbc);

    // set the defaults
    nVarsMax   = 5;
    nLevels    = 2;
    DelayLimit = 0;
    AreaLimit  = 0;
    nGatesMax  = 0;
    TimeLimit  = 0;
    fSkipInvs  = 1;
    fVerbose   = 0;
    fWriteOldFormat = 0;
    ExcludeFile = 0;

    Extra_UtilGetoptReset();
    while ( (c = Extra_UtilGetopt(argc, argv, "ILNTDAEsovh")) != EOF ) 
    {
        switch (c) 
        {
            case 'I':
                nVarsMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nVarsMax < 0 ) 
                    goto usage;
                break;
            case 'L':
                nLevels = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nLevels < 0 ) 
                    goto usage;
                break;
            case 'N':
                nGatesMax = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( nGatesMax < 0 ) 
                    goto usage;
                break;
            case 'T':
                TimeLimit = atoi(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( TimeLimit < 0 ) 
                    goto usage;
                break;
            case 'D':
                DelayLimit = (float)atof(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( DelayLimit <= 0.0 ) 
                    goto usage;
                break;
            case 'A':
                AreaLimit = (float)atof(argv[globalUtilOptind]);
                globalUtilOptind++;
                if ( AreaLimit <= 0.0 ) 
                    goto usage;
                break;
            case 'E':
                ExcludeFile = argv[globalUtilOptind];
                if ( ExcludeFile == 0 )
                    goto usage;
                globalUtilOptind++;
                break;
            case 's':
                fSkipInvs ^= 1;
                break;
            case 'o':
                fWriteOldFormat ^= 1;
                break;
            case 'v':
                fVerbose ^= 1;
                break;
            case 'h':
                goto usage;
                break;
            default:
                goto usage;
        }
    }


    if ( argc != globalUtilOptind + 1 )
    {
        fprintf( pErr, "The genlib library file should be given on the command line.\n" );
        goto usage;
    }

    if ( nVarsMax < 2 || nVarsMax > 6 )
    {
        fprintf( pErr, "The max number of variables (%d) should be more than 1 and less than 7.\n", nVarsMax );
        goto usage;
    }

    // get the input file name
    FileName = argv[globalUtilOptind];
    if ( (pFile = Io_FileOpen( FileName, "open_path", "r", 0 )) == NULL )
//    if ( (pFile = fopen( FileName, "r" )) == NULL )
    {
        fprintf( pErr, "Cannot open input file \"%s\". ", FileName );
        if (( FileName = Extra_FileGetSimilarName( FileName, ".genlib", ".lib", ".gen", ".g", NULL ) ))
            fprintf( pErr, "Did you mean \"%s\"?", FileName );
        fprintf( pErr, "\n" );
        return 1;
    }
    fclose( pFile );

    // set the new network
    pLib = Mio_LibraryRead( FileName, NULL, ExcludeFile, fVerbose );
    if ( pLib == NULL )
    {
        fprintf( pErr, "Reading library has failed.\n" );
        goto usage;
    }

    // compute the gates
    FileName = Extra_FileNameGenericAppend(Mio_LibraryReadName(pLib), ".super");
    Super_Precompute( pLib, nVarsMax, nLevels, nGatesMax, DelayLimit, AreaLimit, TimeLimit, fSkipInvs, fVerbose, FileName );

    // delete the library
    Mio_LibraryDelete( pLib );
    return 0;

usage:
    fprintf( pErr, "usage: super [-ILNT num] [-DA float] [-E file] [-sovh] <genlib_file>\n");
    fprintf( pErr, "\t         precomputes the supergates for the given genlib library\n" );  
    fprintf( pErr, "\t-I num   : the max number of supergate inputs [default = %d]\n", nVarsMax );
    fprintf( pErr, "\t-L num   : the max number of levels of gates [default = %d]\n", nLevels );
    fprintf( pErr, "\t-N num   : the limit on the number of considered supergates [default = %d]\n", nGatesMax );
    fprintf( pErr, "\t-T num   : the approximate runtime limit in seconds [default = %d]\n", TimeLimit );
    fprintf( pErr, "\t-D float : the max delay of the supergates [default = %.2f]\n", DelayLimit );
    fprintf( pErr, "\t-A float : the max area of the supergates [default = %.2f]\n", AreaLimit );
    fprintf( pErr, "\t-E file  : file contains list of genlib gates to exclude\n" );
    fprintf( pErr, "\t-s       : toggle the use of inverters at the inputs [default = %s]\n", (fSkipInvs? "no": "yes") );
    fprintf( pErr, "\t-o       : toggle dumping the supergate library in old format [default = %s]\n", (fWriteOldFormat? "yes": "no") );
    fprintf( pErr, "\t-v       : enable verbose output [default = %s]\n", (fVerbose? "yes" : "no") );
    fprintf( pErr, "\t-h       : print the help message\n");
    fprintf( pErr, "\n");
    fprintf( pErr, "\tHere is a piece of advice on precomputing supergate libraries:\n");
    fprintf( pErr, "\t\n");
    fprintf( pErr, "\tStart with the number of inputs equal to 5 (-I 5), the number of \n");
    fprintf( pErr, "\tlevels equal to 2 (-L 2), the delay equal to 2-3 delays of inverter, \n");
    fprintf( pErr, "\tthe area equal to 2-3 areas of two input NAND, and runtime limit equal \n");
    fprintf( pErr, "\tto 10 seconds (-T 10). Run precomputation and learn from the result.\n");
    fprintf( pErr, "\tDetermine what parameter is most constraining and try to increase \n");
    fprintf( pErr, "\tthe value of that parameter. The goal is to have a well-balanced\n");
    fprintf( pErr, "\tset of constraints and the resulting supergate library containing\n");
    fprintf( pErr, "\tapproximately 5K-20K supergates. Typically, it is better to increase\n");
    fprintf( pErr, "\tdelay limit rather than area limit, because having large-area supergates\n");
    fprintf( pErr, "\tmay result in a considerable increase in area.\n");
    fprintf( pErr, "\t\n");
    fprintf( pErr, "\tNote that a good supergate library for experiments typically can be \n");
    fprintf( pErr, "\tprecomputed in 30 sec or less. Increasing runtime limit makes sense when\n");
    fprintf( pErr, "\tother parameters are well-balanced and it is needed to enumerate more\n");
    fprintf( pErr, "\tchoices to have a good result. In the end, to compute the final library\n");
    fprintf( pErr, "\tthe runtime can be set to 300 sec to ensure the ultimate quality.\n");
    fprintf( pErr, "\tIn some cases, the runtime has to be reduced if the supergate library\n");
    fprintf( pErr, "\tcontains too many supergates (> 500K).\n");
    fprintf( pErr, "\t\n");
    fprintf( pErr, "\tWhen precomputing libraries of 6 inputs (-i 6), start with even more \n");
    fprintf( pErr, "\trestricted parameters and gradually increase them until the goal is met.\n");
    fprintf( pErr, "\t\n");
    return 1;       /* error exit */
}